

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurvey_test.c
# Opt level: O0

void test_xsurvey_ttl_option(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err nVar3;
  char *pcVar4;
  char *pcVar5;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  char *opt;
  int local_10;
  nng_socket nStack_c;
  _Bool b;
  int v;
  nng_socket s;
  
  nVar1 = nng_surveyor0_open_raw(&stack0xfffffffffffffff4);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                         ,0x14a,"%s: expected success, got %s (%d)","nng_surveyor0_open_raw(&s)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_int(nStack_c,"ttl-max",1);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                         ,0x14c,"%s: expected success, got %s (%d)","nng_socket_set_int(s, opt, 1)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar3 = nng_socket_set_int(nStack_c,"ttl-max",0);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar3 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                 ,0x14d,"%s fails with %s","nng_socket_set_int(s, opt, 0)",pcVar4,nVar1);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar5 = nng_strerror(nVar3);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s, opt, 0)",pcVar4,3,
                   pcVar5,(ulong)nVar3);
  nVar1 = nng_socket_set_int(nStack_c,"ttl-max",-1);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar1 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                 ,0x14e,"%s fails with %s","nng_socket_set_int(s, opt, -1)",pcVar4);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar5 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s, opt, -1)",pcVar4,3,
                   pcVar5,(ulong)nVar1);
  nVar1 = nng_socket_set_int(nStack_c,"ttl-max",0x10);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar1 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                 ,0x14f,"%s fails with %s","nng_socket_set_int(s, opt, 16)",pcVar4);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar5 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s, opt, 16)",pcVar4,3,
                   pcVar5,(ulong)nVar1);
  nVar1 = nng_socket_set_int(nStack_c,"ttl-max",0x100);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar1 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                 ,0x150,"%s fails with %s","nng_socket_set_int(s, opt, 256)",pcVar4);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar5 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s, opt, 256)",pcVar4,3,
                   pcVar5,(ulong)nVar1);
  nVar1 = nng_socket_set_int(nStack_c,"ttl-max",3);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                         ,0x151,"%s: expected success, got %s (%d)","nng_socket_set_int(s, opt, 3)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_get_int(nStack_c,"ttl-max",&local_10);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                         ,0x152,"%s: expected success, got %s (%d)","nng_socket_get_int(s, opt, &v)"
                         ,pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(local_10 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                 ,0x153,"%s","v == 3");
  nVar3 = nng_socket_set_bool(nStack_c,"ttl-max",true);
  pcVar4 = nng_strerror(NNG_EBADTYPE);
  acutest_check_((uint)(nVar3 == NNG_EBADTYPE),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                 ,0x154,"%s fails with %s","nng_socket_set_bool(s, opt, true)",pcVar4,nVar1);
  pcVar4 = nng_strerror(NNG_EBADTYPE);
  pcVar5 = nng_strerror(nVar3);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_bool(s, opt, true)",pcVar4,
                   0x1e,pcVar5,(ulong)nVar3);
  nVar1 = nng_socket_get_bool(nStack_c,"ttl-max",(_Bool *)((long)&opt + 7));
  pcVar4 = nng_strerror(NNG_EBADTYPE);
  acutest_check_((uint)(nVar1 == NNG_EBADTYPE),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                 ,0x155,"%s fails with %s","nng_socket_get_bool(s, opt, &b)",pcVar4);
  pcVar4 = nng_strerror(NNG_EBADTYPE);
  pcVar5 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_get_bool(s, opt, &b)",pcVar4,0x1e
                   ,pcVar5,(ulong)nVar1);
  nVar1 = nng_socket_close(nStack_c);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/xsurvey_test.c"
                         ,0x157,"%s: expected success, got %s (%d)","nng_socket_close(s)",pcVar4,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

static void
test_xsurvey_ttl_option(void)
{
	nng_socket  s;
	int         v;
	bool        b;
	const char *opt = NNG_OPT_MAXTTL;

	NUTS_PASS(nng_surveyor0_open_raw(&s));

	NUTS_PASS(nng_socket_set_int(s, opt, 1));
	NUTS_FAIL(nng_socket_set_int(s, opt, 0), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(s, opt, -1), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(s, opt, 16), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(s, opt, 256), NNG_EINVAL);
	NUTS_PASS(nng_socket_set_int(s, opt, 3));
	NUTS_PASS(nng_socket_get_int(s, opt, &v));
	NUTS_TRUE(v == 3);
	NUTS_FAIL(nng_socket_set_bool(s, opt, true), NNG_EBADTYPE);
	NUTS_FAIL(nng_socket_get_bool(s, opt, &b), NNG_EBADTYPE);

	NUTS_CLOSE(s);
}